

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

StructGet * __thiscall MixedArena::alloc<wasm::StructGet>(MixedArena *this)

{
  StructGet *pSVar1;
  
  pSVar1 = (StructGet *)allocSpace(this,0x28,8);
  (pSVar1->super_SpecificExpression<(wasm::Expression::Id)66>).super_Expression._id = StructGetId;
  (pSVar1->super_SpecificExpression<(wasm::Expression::Id)66>).super_Expression.type.id = 0;
  pSVar1->signed_ = false;
  pSVar1->order = Unordered;
  return pSVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }